

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool ApplyEnclosesArgs(ParseNode *fncDecl,ByteCodeGenerator *byteCodeGenerator)

{
  bool bVar1;
  undefined8 in_RAX;
  ParseNodeFnc *pPVar2;
  undefined8 uStack_28;
  ApplyCheck applyCheck;
  
  uStack_28 = in_RAX;
  bVar1 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
  if (((!bVar1) &&
      (((fncDecl->nop != knopFncDecl || ((fncDecl->grfpn & 4) == 0)) &&
       (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeParams == (ParseNodePtr)0x0)))) &&
     ((pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeRest == (ParseNodePtr)0x0 &&
      (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->nestedCount == 0)))) {
    uStack_28 = (ulong)CONCAT25(1,(undefined5)uStack_28);
    pPVar2 = ParseNode::AsParseNodeFnc(fncDecl);
    VisitIndirect<ApplyCheck>
              (pPVar2->pnodeBody,byteCodeGenerator,(ApplyCheck *)((long)&uStack_28 + 5),
               CheckApplyEnclosesArgs,PostCheckApplyEnclosesArgs);
    return (bool)(uStack_28._7_1_ & uStack_28._5_1_);
  }
  return false;
}

Assistant:

bool ApplyEnclosesArgs(ParseNode* fncDecl, ByteCodeGenerator* byteCodeGenerator)
{
    if (byteCodeGenerator->IsInDebugMode())
    {
        // Inspection of the arguments object will be messed up if we do ApplyArgs.
        return false;
    }

    if (!fncDecl->HasVarArguments()
        && fncDecl->AsParseNodeFnc()->pnodeParams == nullptr
        && fncDecl->AsParseNodeFnc()->pnodeRest == nullptr
        && fncDecl->AsParseNodeFnc()->nestedCount == 0)
    {
        ApplyCheck applyCheck;
        applyCheck.matches = true;
        applyCheck.sawApply = false;
        applyCheck.insideApplyCall = false;
        VisitIndirect<ApplyCheck>(fncDecl->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, &applyCheck, &CheckApplyEnclosesArgs, &PostCheckApplyEnclosesArgs);
        return applyCheck.matches&&applyCheck.sawApply;
    }

    return false;
}